

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_sse4.c
# Opt level: O1

void av1_build_compound_diffwtd_mask_d16_sse4_1
               (uint8_t *mask,DIFFWTD_MASK_TYPE mask_type,CONV_BUF_TYPE *src0,int src0_stride,
               CONV_BUF_TYPE *src1,int src1_stride,int h,int w,ConvolveParams *conv_params,int bd)

{
  uint uVar1;
  long lVar2;
  undefined7 in_register_00000031;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar9;
  undefined1 in_XMM4 [16];
  undefined1 auVar10 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar11 [16];
  ushort uVar12;
  short sVar13;
  ushort uVar17;
  short sVar18;
  undefined4 uVar14;
  ushort uVar19;
  short sVar20;
  ushort uVar21;
  short sVar22;
  ushort uVar23;
  short sVar24;
  ushort uVar25;
  short sVar26;
  ushort uVar27;
  short sVar28;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  ushort uVar29;
  short sVar30;
  undefined1 auVar31 [16];
  
  uVar1 = (bd - (conv_params->round_0 + conv_params->round_1)) + 6;
  if (0 < h) {
    auVar6 = ZEXT416((uint)(1 << ((byte)uVar1 & 0x1f)) >> 1);
    auVar6 = pshuflw(auVar6,auVar6,0);
    auVar6._4_4_ = auVar6._0_4_;
    auVar6._8_4_ = auVar6._0_4_;
    auVar6._12_4_ = auVar6._0_4_;
    uVar3 = (uint)((int)CONCAT71(in_register_00000031,mask_type) != 0);
    auVar7 = pshuflw(ZEXT416(uVar3),ZEXT416(uVar3),0);
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    auVar7 = psllw(auVar7,6);
    auVar8 = pshuflw(ZEXT416(-uVar3 | 1),ZEXT416(-uVar3 | 1),0);
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    lVar4 = (long)w;
    uVar5 = 0;
    auVar10 = pmovsxbw(in_XMM4,0x1a1a1a1a1a1a1a1a);
    auVar11 = pmovsxbw(in_XMM5,0x2626262626262626);
    do {
      if (0 < w) {
        lVar2 = 0;
        do {
          auVar31 = psubusw(*(undefined1 (*) [16])(src0 + lVar2),
                            *(undefined1 (*) [16])(src1 + lVar2));
          auVar15 = psubusw(*(undefined1 (*) [16])(src1 + lVar2),
                            *(undefined1 (*) [16])(src0 + lVar2));
          uVar12 = auVar31._0_2_;
          uVar17 = auVar15._0_2_;
          auVar16._0_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._2_2_;
          uVar17 = auVar15._2_2_;
          auVar16._2_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._4_2_;
          uVar17 = auVar15._4_2_;
          auVar16._4_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._6_2_;
          uVar17 = auVar15._6_2_;
          auVar16._6_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._8_2_;
          uVar17 = auVar15._8_2_;
          auVar16._8_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._10_2_;
          uVar17 = auVar15._10_2_;
          auVar16._10_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._12_2_;
          uVar17 = auVar15._12_2_;
          uVar19 = auVar15._14_2_;
          auVar16._12_2_ = (uVar17 < uVar12) * uVar12 | (uVar17 >= uVar12) * uVar17;
          uVar12 = auVar31._14_2_;
          auVar16._14_2_ = (uVar19 < uVar12) * uVar12 | (uVar19 >= uVar12) * uVar19;
          auVar15 = paddusw(auVar16,auVar6);
          uVar9 = (ulong)uVar1;
          uVar12 = (ushort)(auVar15._0_2_ >> uVar9) >> 4;
          uVar17 = (ushort)(auVar15._2_2_ >> uVar9) >> 4;
          uVar19 = (ushort)(auVar15._4_2_ >> uVar9) >> 4;
          uVar21 = (ushort)(auVar15._6_2_ >> uVar9) >> 4;
          uVar23 = (ushort)(auVar15._8_2_ >> uVar9) >> 4;
          uVar25 = (ushort)(auVar15._10_2_ >> uVar9) >> 4;
          uVar27 = (ushort)(auVar15._12_2_ >> uVar9) >> 4;
          uVar29 = (ushort)(auVar15._14_2_ >> uVar9) >> 4;
          sVar13 = auVar10._0_2_;
          sVar18 = auVar10._2_2_;
          sVar20 = auVar10._4_2_;
          sVar22 = auVar10._6_2_;
          sVar24 = auVar10._8_2_;
          sVar26 = auVar10._10_2_;
          sVar28 = auVar10._12_2_;
          sVar30 = auVar10._14_2_;
          auVar15._0_2_ =
               ((ushort)(sVar13 < (short)uVar12) * sVar13 | (sVar13 >= (short)uVar12) * uVar12) +
               auVar11._0_2_;
          auVar15._2_2_ =
               ((ushort)(sVar18 < (short)uVar17) * sVar18 | (sVar18 >= (short)uVar17) * uVar17) +
               auVar11._2_2_;
          auVar15._4_2_ =
               ((ushort)(sVar20 < (short)uVar19) * sVar20 | (sVar20 >= (short)uVar19) * uVar19) +
               auVar11._4_2_;
          auVar15._6_2_ =
               ((ushort)(sVar22 < (short)uVar21) * sVar22 | (sVar22 >= (short)uVar21) * uVar21) +
               auVar11._6_2_;
          auVar15._8_2_ =
               ((ushort)(sVar24 < (short)uVar23) * sVar24 | (sVar24 >= (short)uVar23) * uVar23) +
               auVar11._8_2_;
          auVar15._10_2_ =
               ((ushort)(sVar26 < (short)uVar25) * sVar26 | (sVar26 >= (short)uVar25) * uVar25) +
               auVar11._10_2_;
          auVar15._12_2_ =
               ((ushort)(sVar28 < (short)uVar27) * sVar28 | (sVar28 >= (short)uVar27) * uVar27) +
               auVar11._12_2_;
          auVar15._14_2_ =
               ((ushort)(sVar30 < (short)uVar29) * sVar30 | (sVar30 >= (short)uVar29) * uVar29) +
               auVar11._14_2_;
          auVar15 = psignw(auVar15,auVar8);
          sVar13 = auVar15._0_2_ + auVar7._0_2_;
          sVar18 = auVar15._2_2_ + auVar7._2_2_;
          sVar20 = auVar15._4_2_ + auVar7._4_2_;
          sVar22 = auVar15._6_2_ + auVar7._6_2_;
          sVar24 = auVar15._8_2_ + auVar7._8_2_;
          sVar26 = auVar15._10_2_ + auVar7._10_2_;
          sVar28 = auVar15._12_2_ + auVar7._12_2_;
          sVar30 = auVar15._14_2_ + auVar7._14_2_;
          uVar14 = CONCAT13((0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22),
                            CONCAT12((0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 -
                                     (0xff < sVar20),
                                     CONCAT11((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 -
                                              (0xff < sVar18),
                                              (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 -
                                              (0xff < sVar13))));
          if (lVar2 < lVar4 + -4) {
            *(ulong *)(mask + lVar2) =
                 CONCAT17((0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30),
                          CONCAT16((0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28),
                                   CONCAT15((0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 -
                                            (0xff < sVar26),
                                            CONCAT14((0 < sVar24) * (sVar24 < 0x100) * (char)sVar24
                                                     - (0xff < sVar24),uVar14))));
          }
          else {
            *(undefined4 *)(mask + lVar2) = uVar14;
          }
          lVar2 = lVar2 + 8;
        } while (lVar2 < lVar4);
      }
      uVar5 = uVar5 + 1;
      mask = mask + lVar4;
      src1 = src1 + src1_stride;
      src0 = src0 + src0_stride;
    } while (uVar5 != (uint)h);
  }
  return;
}

Assistant:

void av1_build_compound_diffwtd_mask_d16_sse4_1(
    uint8_t *mask, DIFFWTD_MASK_TYPE mask_type, const CONV_BUF_TYPE *src0,
    int src0_stride, const CONV_BUF_TYPE *src1, int src1_stride, int h, int w,
    ConvolveParams *conv_params, int bd) {
  const int which_inverse = (mask_type == DIFFWTD_38) ? 0 : 1;
  const int mask_base = 38;
  int round =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1 + (bd - 8);
  const __m128i round_const = _mm_set1_epi16((1 << round) >> 1);
  const __m128i mask_base_16 = _mm_set1_epi16(mask_base);
  const __m128i clip_diff = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i add_const =
      _mm_set1_epi16((which_inverse ? AOM_BLEND_A64_MAX_ALPHA : 0));
  const __m128i add_sign = _mm_set1_epi16((which_inverse ? -1 : 1));

  int i, j;
  // When rounding constant is added, there is a possibility of overflow.
  // However that much precision is not required. Code should very well work for
  // other values of DIFF_FACTOR_LOG2 and AOM_BLEND_A64_MAX_ALPHA as well. But
  // there is a possibility of corner case bugs.
  assert(DIFF_FACTOR_LOG2 == 4);
  assert(AOM_BLEND_A64_MAX_ALPHA == 64);
  for (i = 0; i < h; ++i) {
    for (j = 0; j < w; j += 8) {
      const __m128i data_src0 =
          _mm_loadu_si128((__m128i *)&src0[(i * src0_stride) + j]);
      const __m128i data_src1 =
          _mm_loadu_si128((__m128i *)&src1[(i * src1_stride) + j]);

      const __m128i diffa = _mm_subs_epu16(data_src0, data_src1);
      const __m128i diffb = _mm_subs_epu16(data_src1, data_src0);
      const __m128i diff = _mm_max_epu16(diffa, diffb);
      const __m128i diff_round =
          _mm_srli_epi16(_mm_adds_epu16(diff, round_const), round);
      const __m128i diff_factor = _mm_srli_epi16(diff_round, DIFF_FACTOR_LOG2);
      const __m128i diff_mask = _mm_adds_epi16(diff_factor, mask_base_16);
      __m128i diff_clamp = _mm_min_epi16(diff_mask, clip_diff);
      // clamp to 0 can be skipped since we are using add and saturate
      // instruction

      const __m128i diff_sign = _mm_sign_epi16(diff_clamp, add_sign);
      const __m128i diff_const_16 = _mm_add_epi16(diff_sign, add_const);

      // 8 bit conversion and saturation to uint8
      const __m128i res_8 = _mm_packus_epi16(diff_const_16, diff_const_16);

      // Store values into the destination buffer
      __m128i *const dst = (__m128i *)&mask[i * w + j];

      if ((w - j) > 4) {
        _mm_storel_epi64(dst, res_8);
      } else {  // w==4
        *(int *)dst = _mm_cvtsi128_si32(res_8);
      }
    }
  }
}